

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

void __thiscall
leveldb::DBImpl::GetApproximateSizes(DBImpl *this,Range *range,int n,uint64_t *sizes)

{
  Version *this_00;
  int iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  InternalKey k2;
  InternalKey k1;
  InternalKey local_70;
  InternalKey local_50;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar1 == 0) {
    this_00 = this->versions_->current_;
    Version::Ref(this_00);
    if (0 < n) {
      uVar5 = 0;
      do {
        InternalKey::InternalKey(&local_50,(Slice *)range,0xffffffffffffff,kTypeValue);
        InternalKey::InternalKey
                  (&local_70,(Slice *)((long)range + 0x10),0xffffffffffffff,kTypeValue);
        uVar2 = VersionSet::ApproximateOffsetOf(this->versions_,this_00,&local_50);
        uVar3 = VersionSet::ApproximateOffsetOf(this->versions_,this_00,&local_70);
        uVar4 = 0;
        if (uVar2 <= uVar3) {
          uVar4 = uVar3 - uVar2;
        }
        sizes[uVar5] = uVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.rep_._M_dataplus._M_p != &local_70.rep_.field_2) {
          operator_delete(local_70.rep_._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50.rep_._M_dataplus._M_p != &local_50.rep_.field_2) {
          operator_delete(local_50.rep_._M_dataplus._M_p);
        }
        uVar5 = uVar5 + 1;
        range = (Range *)((long)range + 0x20);
      } while ((uint)n != uVar5);
    }
    Version::Unref(this_00);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void DBImpl::GetApproximateSizes(const Range* range, int n, uint64_t* sizes) {
  // TODO(opt): better implementation
  MutexLock l(&mutex_);
  Version* v = versions_->current();
  v->Ref();

  for (int i = 0; i < n; i++) {
    // Convert user_key into a corresponding internal key.
    InternalKey k1(range[i].start, kMaxSequenceNumber, kValueTypeForSeek);
    InternalKey k2(range[i].limit, kMaxSequenceNumber, kValueTypeForSeek);
    uint64_t start = versions_->ApproximateOffsetOf(v, k1);
    uint64_t limit = versions_->ApproximateOffsetOf(v, k2);
    sizes[i] = (limit >= start ? limit - start : 0);
  }

  v->Unref();
}